

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Moira.cpp
# Opt level: O1

void __thiscall moira::Moira::setModel(Moira *this,Model cpuModel,Model dasmModel)

{
  u32 *puVar1;
  uint uVar2;
  uint uVar3;
  
  if ((this->cpuModel != cpuModel) || (this->dasmModel != dasmModel)) {
    this->cpuModel = cpuModel;
    this->dasmModel = dasmModel;
    createJumpTable(this,cpuModel,dasmModel);
    uVar2 = this->cpuModel - M68EC020;
    uVar3 = 0xffff;
    if (uVar2 < 4) {
      uVar3 = *(uint *)(&DAT_0047aa7c + (ulong)uVar2 * 4);
    }
    puVar1 = &(this->reg).cacr;
    *puVar1 = *puVar1 & uVar3;
    *(byte *)&this->flags = (byte)this->flags & 0xfb;
  }
  return;
}

Assistant:

void
Moira::setModel(Model cpuModel, Model dasmModel)
{
    if (this->cpuModel != cpuModel || this->dasmModel != dasmModel) {
        
        this->cpuModel = cpuModel;
        this->dasmModel = dasmModel;

        createJumpTable(cpuModel, dasmModel);
        
        reg.cacr &= cacrMask();
        flags &= ~State::LOOPING;
    }
}